

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_draw_image.cxx
# Opt level: O2

void bgr_converter(uchar *from,uchar *to,int w,int delta)

{
  uchar uVar1;
  uchar uVar2;
  uchar *puVar3;
  bool bVar4;
  
  puVar3 = from + 2;
  while (bVar4 = w != 0, w = w + -1, bVar4) {
    uVar1 = puVar3[-2];
    uVar2 = puVar3[-1];
    *to = *puVar3;
    to[1] = uVar2;
    to[2] = uVar1;
    to = to + 3;
    puVar3 = puVar3 + delta;
  }
  return;
}

Assistant:

static void bgr_converter(const uchar *from, uchar *to, int w, int delta) {
  for (; w--; from += delta) {
    uchar r = from[0];
    uchar g = from[1];
    *to++ = from[2];
    *to++ = g;
    *to++ = r;
  }
}